

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::foo(TestInterfaceImpl *this,FooContext context)

{
  uint uVar1;
  long *in_RDX;
  uint uVar2;
  Reader value;
  uint sequence;
  DebugComparison<int,_unsigned_int> _kjCondition_1;
  Builder result;
  Reader params;
  uint local_58 [6];
  int local_40 [2];
  char *pcStack_38;
  size_t local_30;
  
  sequence = *(uint *)context.hook[1]._vptr_CallContextHook;
  *(uint *)context.hook[1]._vptr_CallContextHook = sequence + 1;
  (**(code **)*in_RDX)(&_kjCondition_1);
  result._builder.pointers = (WirePointer *)CONCAT71(_kjCondition_1._25_7_,_kjCondition_1.result);
  result._builder.data = (void *)_kjCondition_1.op.content.size_;
  result._builder.segment = (SegmentBuilder *)_kjCondition_1._0_8_;
  result._builder.capTable = (CapTableBuilder *)_kjCondition_1.op.content.ptr;
  uVar2 = 0;
  PointerReader::getStruct(&params._reader,(PointerReader *)&result,(word *)0x0);
  if ((0x5f < params._reader.dataSize) && (*(int *)((long)params._reader.data + 8) < 0)) {
    uVar1 = 0xffffffff;
    if (0x5f < params._reader.dataSize) {
      uVar1 = ~*(uint *)((long)params._reader.data + 8);
    }
    result._builder.segment = (SegmentBuilder *)&sequence;
    result._builder.capTable = (CapTableBuilder *)CONCAT44(result._builder.capTable._4_4_,uVar1);
    result._builder.data = anon_var_dwarf_a9f8;
    result._builder.dataSize._0_1_ = sequence == uVar1;
    result._builder.pointers = (WirePointer *)&DAT_00000005;
    if ((!(bool)(undefined1)result._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,900,ERROR,
                 "\"failed: expected \" \"sequence == params.getExpectedCallCount()\", _kjCondition"
                 ,(char (*) [59])"failed: expected sequence == params.getExpectedCallCount()",
                 (DebugComparison<unsigned_int_&,_int> *)&result);
    }
  }
  local_58[0] = local_58[0] & 0xffffff00;
  (**(code **)(*in_RDX + 0x10))(local_40);
  _kjCondition_1.op.content.size_ = local_30;
  _kjCondition_1.op.content.ptr = pcStack_38;
  PointerBuilder::getStruct
            (&result._builder,(PointerBuilder *)&_kjCondition_1,(StructSize)0x10000,(word *)0x0);
  if (0x1f < params._reader.dataSize) {
    uVar2 = *params._reader.data;
  }
  _kjCondition_1.right = uVar2;
  _kjCondition_1.left = 0x7b;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = uVar2 == 0x7b;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    local_58[0] = 0;
    local_40[0] = 0x7b;
    if (0x1f < params._reader.dataSize) {
      local_58[0] = *params._reader.data;
    }
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x387,ERROR,
               "\"failed: expected \" \"(123) == (params.getI())\", _kjCondition, 123, params.getI()"
               ,(char (*) [42])"failed: expected (123) == (params.getI())",&_kjCondition_1,local_40,
               local_58);
  }
  if (params._reader.dataSize < 0x21) {
    _kjCondition_1._0_8_ = (ulong)(uint7)_kjCondition_1._1_7_ << 8;
  }
  else {
    _kjCondition_1._0_8_ =
         CONCAT71(_kjCondition_1._1_7_,*(byte *)((long)params._reader.data + 4)) &
         0xffffffffffffff01;
    if ((*(byte *)((long)params._reader.data + 4) & 1) != 0) goto LAB_001fd04e;
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x388,ERROR,"\"failed: expected \" \"params.getJ()\", _kjCondition",
               (char (*) [31])"failed: expected params.getJ()",
               (DebugExpression<bool> *)&_kjCondition_1);
  }
LAB_001fd04e:
  _kjCondition_1._0_8_ = result._builder.segment;
  _kjCondition_1.op.content.ptr = (char *)result._builder.capTable;
  _kjCondition_1.op.content.size_ = (size_t)result._builder.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition_1,value);
  kj::_::readyNow();
  (this->super_Server)._vptr_Server = (_func_int **)_kjCondition_1._0_8_;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::foo(FooContext context) {
  uint sequence = callCount++;
  auto params = context.getParams();
  if (params.getExpectedCallCount() >= 0) {
    KJ_EXPECT(sequence == params.getExpectedCallCount());
  }
  auto result = context.getResults();
  EXPECT_EQ(123, params.getI());
  EXPECT_TRUE(params.getJ());
  result.setX("foo");
  return kj::READY_NOW;
}